

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O1

void __thiscall tcu::Exception::Exception(Exception *this,string *message)

{
  pointer pcVar1;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__Exception_00d4e5e8;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

Exception::Exception (const std::string& message)
	: std::runtime_error(message)
	, m_message			(message)
{
}